

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<9,_2,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Vector<float,_3> local_8c;
  Vector<float,_3> local_80;
  tcu local_74 [12];
  undefined1 local_68 [16];
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  undefined1 local_48 [16];
  VecAccess<float,_4,_3> local_38;
  
  getInputValue<2,5>((ShaderEvalContext *)local_48,(int)evalCtx);
  local_80.m_data[2] = (float)local_48._4_4_ + (float)local_48._12_4_;
  local_80.m_data[0] = (float)local_48._0_4_;
  local_80.m_data[1] = (float)local_48._8_4_;
  getInputValue<2,5>((ShaderEvalContext *)local_68,(int)evalCtx);
  increment<float,2,2>((MatrixCaseUtils *)&local_58,(Matrix<float,_2,_2> *)local_68);
  local_8c.m_data[2] = local_54 + local_4c;
  local_8c.m_data[0] = local_58;
  local_8c.m_data[1] = local_50;
  tcu::operator+(local_74,&local_80,&local_8c);
  local_38.m_vector = &evalCtx->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_74);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}